

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void __thiscall Analysis::UpdateParameterDict(Analysis *this,string *param_filename)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (param_filename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + param_filename->_M_string_length);
  ParameterReader::readFromFile(&this->paraRdr_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  ParameterReader::echo(&this->paraRdr_);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(std::string param_filename) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.echo();
}